

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateLengthDelim
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  FieldDescriptor *pFVar3;
  EnumDescriptor *pEVar4;
  OneofDescriptor *pOVar5;
  string *args;
  Descriptor *pDVar6;
  LogMessage *pLVar7;
  Options *in_RCX;
  LogFinisher local_1a1;
  LogMessage local_1a0;
  int local_164;
  string local_160;
  string local_140;
  string local_120;
  int local_fc;
  string local_f8;
  LogFinisher local_d2;
  byte local_d1;
  LogMessage local_d0;
  allocator local_91;
  string local_90;
  FieldDescriptor *local_70;
  FieldDescriptor *val;
  char *pcStack_60;
  Type field_type;
  int local_58 [4];
  char *local_48;
  undefined1 local_40 [8];
  string enum_type;
  FieldDescriptor *field_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  enum_type.field_2._8_8_ = field;
  bVar1 = FieldDescriptor::is_packable(field);
  if (bVar1) {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)enum_type.field_2._8_8_);
    if ((TVar2 != TYPE_ENUM) ||
       (bVar1 = HasPreservingUnknownEnumSemantics((FieldDescriptor *)enum_type.field_2._8_8_), bVar1
       )) {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)enum_type.field_2._8_8_);
      pcStack_60 = DeclaredTypeMethodName(TVar2);
      Formatter::operator()
                (format,
                 "ptr = ::$proto_ns$::internal::Packed$1$Parser($msg$_internal_mutable_$name$(), ptr, ctx);\n"
                 ,&stack0xffffffffffffffa0);
    }
    else {
      pEVar4 = FieldDescriptor::enum_type((FieldDescriptor *)enum_type.field_2._8_8_);
      QualifiedClassName_abi_cxx11_
                ((string *)local_40,(cpp *)pEVar4,(EnumDescriptor *)this->options_,in_RCX);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)enum_type.field_2._8_8_);
      local_48 = DeclaredTypeMethodName(TVar2);
      local_58[0] = FieldDescriptor::number((FieldDescriptor *)enum_type.field_2._8_8_);
      Formatter::operator()
                (format,
                 "ptr = ::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>($msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, &$msg$_internal_metadata_, $3$);\n"
                 ,&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 local_58);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  else {
    val._4_4_ = FieldDescriptor::type((FieldDescriptor *)enum_type.field_2._8_8_);
    if (val._4_4_ == TYPE_STRING) {
      GenerateStrings(this,format,(FieldDescriptor *)enum_type.field_2._8_8_,true);
    }
    else if (val._4_4_ == TYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map((FieldDescriptor *)enum_type.field_2._8_8_);
      if (bVar1) {
        pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)enum_type.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,"value",&local_91);
        pFVar3 = Descriptor::FindFieldByName(pDVar6,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        local_d1 = 0;
        local_70 = pFVar3;
        if (pFVar3 == (FieldDescriptor *)0x0) {
          in_RCX = (Options *)0x2f4;
          internal::LogMessage::LogMessage
                    (&local_d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                     ,0x2f4);
          local_d1 = 1;
          pLVar7 = internal::LogMessage::operator<<(&local_d0,"CHECK failed: val: ");
          internal::LogFinisher::operator=(&local_d2,pLVar7);
        }
        if ((local_d1 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_d0);
        }
        TVar2 = FieldDescriptor::type(local_70);
        if ((TVar2 != TYPE_ENUM) ||
           (bVar1 = HasPreservingUnknownEnumSemantics((FieldDescriptor *)enum_type.field_2._8_8_),
           bVar1)) {
          Formatter::operator()<>(format,"ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
        }
        else {
          pEVar4 = FieldDescriptor::enum_type(local_70);
          QualifiedClassName_abi_cxx11_
                    (&local_f8,(cpp *)pEVar4,(EnumDescriptor *)this->options_,in_RCX);
          local_fc = FieldDescriptor::number((FieldDescriptor *)enum_type.field_2._8_8_);
          Formatter::operator()
                    (format,
                     "auto object = ::$proto_ns$::internal::InitEnumParseWrapper<$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, $2$, &$msg$_internal_metadata_);\nptr = ctx->ParseMessage(&object, ptr);\n"
                     ,&local_f8,&local_fc);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
      else {
        bVar1 = IsLazy((FieldDescriptor *)enum_type.field_2._8_8_,this->options_,this->scc_analyzer_
                      );
        if (bVar1) {
          pOVar5 = FieldDescriptor::real_containing_oneof
                             ((FieldDescriptor *)enum_type.field_2._8_8_);
          if (pOVar5 == (OneofDescriptor *)0x0) {
            bVar1 = HasHasbit((FieldDescriptor *)enum_type.field_2._8_8_);
            if (bVar1) {
              Formatter::operator()<>
                        (format,
                         "_Internal::set_has_$name$(&$has_bits$);\nauto* lazy_field = &$msg$$name$_;\n"
                        );
            }
            else {
              Formatter::operator()<>(format,"auto* lazy_field = &$msg$$name$_;\n");
            }
          }
          else {
            pOVar5 = FieldDescriptor::containing_oneof((FieldDescriptor *)enum_type.field_2._8_8_);
            args = OneofDescriptor::name_abi_cxx11_(pOVar5);
            Formatter::operator()
                      (format,
                       "if (!$msg$_internal_has_$name$()) {\n  $msg$clear_$1$();\n  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n      ::$proto_ns$::internal::LazyField>($msg$GetArenaForAllocation());\n  $msg$set_has_$name$();\n}\nauto* lazy_field = $msg$$1$_.$name$_;\n"
                       ,args);
          }
          FieldMessageTypeName_abi_cxx11_
                    (&local_120,(cpp *)enum_type.field_2._8_8_,(FieldDescriptor *)this->options_,
                     (Options *)format);
          Formatter::operator()
                    (format,
                     "::$proto_ns$::internal::LazyFieldParseHelper<\n  ::$proto_ns$::internal::LazyField> parse_helper(\n    $1$::default_instance(),\n    $msg$GetArenaForAllocation(), lazy_field);\nptr = ctx->ParseMessage(&parse_helper, ptr);\n"
                     ,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
        }
        else {
          bVar1 = IsImplicitWeakField((FieldDescriptor *)enum_type.field_2._8_8_,this->options_,
                                      this->scc_analyzer_);
          if (bVar1) {
            bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)enum_type.field_2._8_8_);
            if (bVar1) {
              pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)enum_type.field_2._8_8_);
              QualifiedDefaultInstanceName_abi_cxx11_
                        (&local_140,(cpp *)pDVar6,(Descriptor *)this->options_,in_RCX);
              Formatter::operator()
                        (format,
                         "ptr = ctx->ParseMessage($msg$$name$_.AddWeak(reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)), ptr);\n"
                         ,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
            }
            else {
              Formatter::operator()<>
                        (format,"ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), ptr);\n"
                        );
            }
          }
          else {
            bVar1 = IsWeak((FieldDescriptor *)enum_type.field_2._8_8_,this->options_);
            if (bVar1) {
              pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)enum_type.field_2._8_8_);
              QualifiedDefaultInstanceName_abi_cxx11_
                        (&local_160,(cpp *)pDVar6,(Descriptor *)this->options_,in_RCX);
              local_164 = FieldDescriptor::number((FieldDescriptor *)enum_type.field_2._8_8_);
              Formatter::operator()
                        (format,
                         "{\n  auto* default_ = &reinterpret_cast<const Message&>($1$);\n  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage($2$, default_), ptr);\n}\n"
                         ,&local_160,&local_164);
              std::__cxx11::string::~string((string *)&local_160);
            }
            else {
              Formatter::operator()<>
                        (format,"ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), ptr);\n")
              ;
            }
          }
        }
      }
    }
    else if (val._4_4_ == TYPE_BYTES) {
      GenerateStrings(this,format,(FieldDescriptor *)enum_type.field_2._8_8_,false);
    }
    else {
      internal::LogMessage::LogMessage
                (&local_1a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x339);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_1a0,"Illegal combination for length delimited wiretype ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7," filed type is ");
      TVar2 = FieldDescriptor::type((FieldDescriptor *)enum_type.field_2._8_8_);
      pLVar7 = internal::LogMessage::operator<<(pLVar7,TVar2);
      internal::LogFinisher::operator=(&local_1a1,pLVar7);
      internal::LogMessage::~LogMessage(&local_1a0);
    }
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateLengthDelim(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (field->is_packable()) {
    if (field->type() == FieldDescriptor::TYPE_ENUM &&
        !HasPreservingUnknownEnumSemantics(field)) {
      std::string enum_type = QualifiedClassName(field->enum_type(), options_);
      format(
          "ptr = "
          "::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>("
          "$msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, "
          "&$msg$_internal_metadata_, $3$);\n",
          DeclaredTypeMethodName(field->type()), enum_type, field->number());
    } else {
      format(
          "ptr = ::$proto_ns$::internal::Packed$1$Parser("
          "$msg$_internal_mutable_$name$(), ptr, ctx);\n",
          DeclaredTypeMethodName(field->type()));
    }
  } else {
    auto field_type = field->type();
    switch (field_type) {
      case FieldDescriptor::TYPE_STRING:
        GenerateStrings(format, field, true /* utf8 */);
        break;
      case FieldDescriptor::TYPE_BYTES:
        GenerateStrings(format, field, false /* utf8 */);
        break;
      case FieldDescriptor::TYPE_MESSAGE: {
        if (field->is_map()) {
          const FieldDescriptor* val =
              field->message_type()->FindFieldByName("value");
          GOOGLE_CHECK(val);
          if (val->type() == FieldDescriptor::TYPE_ENUM &&
              !HasPreservingUnknownEnumSemantics(field)) {
            format(
                "auto object = "
                "::$proto_ns$::internal::InitEnumParseWrapper<"
                "$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, "
                "$2$, &$msg$_internal_metadata_);\n"
                "ptr = ctx->ParseMessage(&object, ptr);\n",
                QualifiedClassName(val->enum_type(), options_),
                field->number());
          } else {
            format("ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
          }
        } else if (IsLazy(field, options_, scc_analyzer_)) {
          if (field->real_containing_oneof()) {
            format(
                "if (!$msg$_internal_has_$name$()) {\n"
                "  $msg$clear_$1$();\n"
                "  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
                "      ::$proto_ns$::internal::LazyField>("
                "$msg$GetArenaForAllocation());\n"
                "  $msg$set_has_$name$();\n"
                "}\n"
                "auto* lazy_field = $msg$$1$_.$name$_;\n",
                field->containing_oneof()->name());
          } else if (HasHasbit(field)) {
            format(
                "_Internal::set_has_$name$(&$has_bits$);\n"
                "auto* lazy_field = &$msg$$name$_;\n");
          } else {
            format("auto* lazy_field = &$msg$$name$_;\n");
          }
          format(
              "::$proto_ns$::internal::LazyFieldParseHelper<\n"
              "  ::$proto_ns$::internal::LazyField> parse_helper(\n"
              "    $1$::default_instance(),\n"
              "    $msg$GetArenaForAllocation(), lazy_field);\n"
              "ptr = ctx->ParseMessage(&parse_helper, ptr);\n",
              FieldMessageTypeName(field, options_));
        } else if (IsImplicitWeakField(field, options_, scc_analyzer_)) {
          if (!field->is_repeated()) {
            format(
                "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), "
                "ptr);\n");
          } else {
            format(
                "ptr = ctx->ParseMessage($msg$$name$_.AddWeak("
                "reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)"
                "), ptr);\n",
                QualifiedDefaultInstanceName(field->message_type(), options_));
          }
        } else if (IsWeak(field, options_)) {
          format(
              "{\n"
              "  auto* default_ = &reinterpret_cast<const Message&>($1$);\n"
              "  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage("
              "$2$, default_), ptr);\n"
              "}\n",
              QualifiedDefaultInstanceName(field->message_type(), options_),
              field->number());
        } else {
          format(
              "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), "
              "ptr);\n");
        }
        break;
      }
      default:
        GOOGLE_LOG(FATAL) << "Illegal combination for length delimited wiretype "
                   << " filed type is " << field->type();
    }
  }
}